

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O0

int f_graddesc_test(void *data,int x,int z,double p)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  bool bVar5;
  bool bVar6;
  int unaff_retaddr;
  int unaff_retaddr_00;
  int in_stack_00000008;
  int match_req;
  int match_any;
  int match_exc;
  int id;
  int idx;
  gdt_info_t *info;
  undefined4 local_4;
  
  if ((*(long *)(in_RDI + 0x70) == 0) || (**(char **)(in_RDI + 0x70) == '\0')) {
    iVar3 = (in_EDX - *(int *)(in_RDI + 0x18)) * *(int *)(in_RDI + 0x1c) +
            (in_ESI - *(int *)(in_RDI + 0x14));
    if (*(int *)(*(long *)(in_RDI + 8) + (long)iVar3 * 4) == -1) {
      iVar4 = getBiomeAt(_match_any,match_req,in_stack_00000008,unaff_retaddr_00,unaff_retaddr);
      *(int *)(*(long *)(in_RDI + 8) + (long)iVar3 * 4) = iVar4;
      if (iVar4 < 0x80) {
        *(ulong *)(in_RDI + 0x30) = 1L << ((byte)iVar4 & 0x3f) | *(ulong *)(in_RDI + 0x30);
      }
      else {
        *(ulong *)(in_RDI + 0x38) = 1L << ((byte)iVar4 + 0x80 & 0x3f) | *(ulong *)(in_RDI + 0x38);
      }
      bVar1 = *(long *)(in_RDI + 0x50) == 0;
      bVar2 = *(long *)(in_RDI + 0x58) == 0;
      if ((bVar1 && bVar2) ||
         (((*(ulong *)(in_RDI + 0x30) & *(ulong *)(in_RDI + 0x50)) == 0 &&
          ((*(ulong *)(in_RDI + 0x38) & *(ulong *)(in_RDI + 0x58)) == 0)))) {
        bVar5 = true;
        if ((*(ulong *)(in_RDI + 0x30) & *(ulong *)(in_RDI + 0x60)) == 0) {
          bVar5 = (*(ulong *)(in_RDI + 0x38) & *(ulong *)(in_RDI + 0x68)) != 0;
        }
        bVar6 = false;
        if ((*(ulong *)(in_RDI + 0x30) & *(ulong *)(in_RDI + 0x40)) == *(ulong *)(in_RDI + 0x40)) {
          bVar6 = (*(ulong *)(in_RDI + 0x38) & *(ulong *)(in_RDI + 0x48)) ==
                  *(ulong *)(in_RDI + 0x48);
        }
        if (((bVar1 && bVar2) &&
            ((bool)(bVar5 | (*(long *)(in_RDI + 0x60) == 0 && *(long *)(in_RDI + 0x68) == 0)))) &&
           ((bool)(bVar6 | (*(long *)(in_RDI + 0x40) == 0 && *(long *)(in_RDI + 0x48) == 0)))) {
          local_4 = 1;
        }
        else {
          local_4 = 0;
        }
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = 0;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int f_graddesc_test(void *data, int x, int z, double p)
{
    (void) p;
    gdt_info_t *info = (gdt_info_t *) data;
    if (info->stop && *info->stop)
        return 1;
    int idx = (z - info->r.z) * info->r.sx + (x - info->r.x);
    if (info->ids[idx] != -1)
        return 0;
    int id = getBiomeAt(info->g, info->r.scale, x, info->r.y, z);
    info->ids[idx] = id;
    if (id < 128) info->b |= (1ULL << id);
    else info->m |= (1ULL << (id-128));

    // check if we know enough to stop
    int match_exc = (info->bexc|info->mexc) == 0;
    int match_any = (info->bany|info->many) == 0;
    int match_req = (info->breq|info->mreq) == 0;
    if (!match_exc && ((info->b & info->bexc) || (info->m & info->mexc)))
        return 1; // encountered an excluded biome -> stop
    match_any |= ((info->b & info->bany) || (info->m & info->many));
    match_req |= ((info->b & info->breq) == info->breq &&
                  (info->m & info->mreq) == info->mreq);
    if (match_exc && match_any && match_req)
        return 1; // all conditions met -> stop
    return 0;
}